

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall Assimp::AMFImporter::Clear(AMFImporter *this)

{
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *this_00;
  iterator __begin2;
  _List_node_base *p_Var1;
  
  this->mNodeElement_Cur = (CAMFImporter_NodeElement *)0x0;
  (this->mUnit)._M_string_length = 0;
  *(this->mUnit)._M_dataplus._M_p = '\0';
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Material,_std::allocator<Assimp::AMFImporter::SPP_Material>_>::clear
            (&this->mMaterial_Converted);
  std::__cxx11::
  list<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>::clear
            (&this->mTexture_Converted);
  p_Var1 = (this->mNodeElement_List).
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  this_00 = &this->mNodeElement_List;
  if (p_Var1 != (_List_node_base *)this_00) {
    for (; p_Var1 != (_List_node_base *)this_00; p_Var1 = p_Var1->_M_next) {
      if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
        (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 8))();
      }
    }
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    clear(this_00);
    return;
  }
  return;
}

Assistant:

void AMFImporter::Clear()
{
	mNodeElement_Cur = nullptr;
	mUnit.clear();
	mMaterial_Converted.clear();
	mTexture_Converted.clear();
	// Delete all elements
	if(!mNodeElement_List.empty())
	{
		for(CAMFImporter_NodeElement* ne: mNodeElement_List) { delete ne; }

		mNodeElement_List.clear();
	}
}